

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O3

S2LatLng s2textformat::MakeLatLngOrDie(string_view str)

{
  R2Point RVar1;
  bool bVar2;
  ostream *poVar3;
  S2LatLng *in_RCX;
  size_type sVar4;
  string_view str_00;
  string_view piece;
  S2LatLng latlng;
  VType local_38;
  VType VStack_30;
  S2LogMessage local_28;
  
  str_00.ptr_ = (char *)str.length_;
  local_38 = 0.0;
  VStack_30 = 0.0;
  str_00.length_ = (size_type)&local_38;
  bVar2 = MakeLatLng((s2textformat *)str.ptr_,str_00,in_RCX);
  if (bVar2) {
    RVar1.c_[1] = VStack_30;
    RVar1.c_[0] = local_38;
    return (R2Point)(R2Point)RVar1.c_;
  }
  sVar4 = 3;
  S2LogMessage::S2LogMessage
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x74,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_28.stream_,"Check failed: MakeLatLng(str, &latlng) ",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(local_28.stream_,": str == \"",10);
  piece.length_ = sVar4;
  piece.ptr_ = str_00.ptr_;
  poVar3 = absl::operator<<((absl *)local_28.stream_,(ostream *)str.ptr_,piece);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  abort();
}

Assistant:

S2LatLng MakeLatLngOrDie(string_view str) {
  S2LatLng latlng;
  S2_CHECK(MakeLatLng(str, &latlng)) << ": str == \"" << str << "\"";
  return latlng;
}